

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void kj::_::Debug::log<char_const(&)[49],float,float>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [49],
               float *params_1,float *params_2)

{
  undefined4 in_register_00000014;
  float *params_00;
  float *params_01;
  long lVar1;
  String argValues [3];
  
  str<char_const(&)[49]>
            (argValues,(kj *)params,(char (*) [49])CONCAT44(in_register_00000014,severity));
  str<float&>(argValues + 1,(kj *)params_1,params_00);
  str<float&>(argValues + 2,(kj *)params_2,params_01);
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)argValues,(ArrayPtr<kj::String>)argValues[0].content._0_16_);
  lVar1 = 0x30;
  do {
    Array<char>::~Array((Array<char> *)((long)&argValues[0].content.ptr + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}